

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::createImportVarDeclarationNode
          (Parser *this,vector<Node_*,_std::allocator<Node_*>_> *var_keys)

{
  pointer *pppNVar1;
  Token *pTVar2;
  iterator iVar3;
  Node *this_00;
  Node *this_01;
  Node **__args;
  ulong uVar4;
  long lVar5;
  pointer ppNVar6;
  Node *declarator;
  Node *local_48;
  vector<Node*,std::allocator<Node*>> *local_40;
  Parser *local_38;
  
  this_00 = (Node *)operator_new(0x30);
  local_38 = this;
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = &emptyToken;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_IMPORT_VAR_DECLARATION;
  ppNVar6 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppNVar6) {
    local_40 = (vector<Node*,std::allocator<Node*>> *)&this_00->children;
    lVar5 = 0;
    uVar4 = 0;
    do {
      this_01 = (Node *)operator_new(0x30);
      pTVar2 = ppNVar6[uVar4]->tok;
      CompilationContext::Poolable::Poolable((Poolable *)this_01,local_38->ctx);
      this_01->tok = pTVar2;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01->nodeType = PNT_UNKNOWN;
      this_01->nodeType = PNT_VAR_DECLARATOR;
      __args = (Node **)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar5);
      iVar3._M_current =
           (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48 = this_01;
      if (iVar3._M_current ==
          (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&this_01->children,iVar3,__args);
      }
      else {
        *iVar3._M_current = *__args;
        pppNVar1 = &(this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      iVar3._M_current =
           (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  (local_40,iVar3,&local_48);
      }
      else {
        *iVar3._M_current = local_48;
        pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      uVar4 = uVar4 + 1;
      ppNVar6 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 8;
    } while (uVar4 < (ulong)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3));
  }
  return this_00;
}

Assistant:

Node * createImportVarDeclarationNode(vector<Node *> var_keys)
  {
    Node * n = new Node(ctx, emptyToken);
    n->nodeType = PNT_IMPORT_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      n->children.push_back(declarator);
    }

    return n;
  }